

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

void Saig_ManCexMinDerivePhasePriority
               (Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis,Vec_Vec_t *vFramePPs,int f,
               Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar3;
  int iVar4;
  
  pVVar2 = Vec_VecEntryInt(vFrameCis,f);
  p = Vec_VecEntryInt(vFramePPs,f);
  iVar4 = 0;
  do {
    if (pVVar2->nSize <= iVar4) {
      iVar4 = 0;
      if (pCex->iFrame == f) {
        pVVar2 = (Vec_Int_t *)0x0;
      }
      else {
        pVVar2 = Vec_VecEntryInt(vFrameCis,f + 1);
      }
      Saig_ManCexMinGetCos(pAig,pCex,pVVar2,vRoots);
      Aig_ManIncrementTravId(pAig);
      for (; iVar4 < vRoots->nSize; iVar4 = iVar4 + 1) {
        iVar1 = Vec_IntEntry(vRoots,iVar4);
        pAVar3 = Aig_ManObj(pAig,iVar1);
        Saig_ManCexMinDerivePhasePriority_rec(pAig,pAVar3);
      }
      return;
    }
    iVar1 = Vec_IntEntry(pVVar2,iVar4);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    iVar1 = Vec_IntEntry(p,iVar4);
    (pAVar3->field_5).iData = iVar1;
    iVar4 = iVar4 + 1;
  } while (-1 < iVar1);
  __assert_fail("pObj->iData >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                ,0xe2,
                "void Saig_ManCexMinDerivePhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *, Vec_Vec_t *, int, Vec_Int_t *)"
               );
}

Assistant:

void Saig_ManCexMinDerivePhasePriority( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis, Vec_Vec_t * vFramePPs, int f, Vec_Int_t * vRoots )
{
    Vec_Int_t * vFramePPsOne, * vFrameCisOne, * vLeaves;
    Aig_Obj_t * pObj;
    int i;
    // set PP for the CIs
    vFrameCisOne = Vec_VecEntryInt( vFrameCis, f );
    vFramePPsOne = Vec_VecEntryInt( vFramePPs, f );
    Aig_ManForEachObjVec( vFrameCisOne, pAig, pObj, i )
    {
        pObj->iData = Vec_IntEntry( vFramePPsOne, i );
        assert( pObj->iData >= 0 );
    }
//    if ( f == 0 )
//        Saig_ManCexMinVerifyPhase( pAig, pCex, f );

    // create roots
    vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
    Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
    // derive for the nodes starting from the roots
    Aig_ManIncrementTravId( pAig );
    Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
    {
        Saig_ManCexMinDerivePhasePriority_rec( pAig, pObj );
//        if ( f == 0 )
//            assert( (pObj->iData & 1) == pObj->fPhase );
    }
}